

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall fmt::v9::detail::bigint::subtract_aligned(bigint *this,bigint *other)

{
  size_t sVar1;
  uint *puVar2;
  uint *puVar3;
  int iVar4;
  uint uVar5;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong uVar6;
  
  if (other->exp_ < this->exp_) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h"
                ,0xab6,"unaligned bigints");
  }
  iVar4 = compare(this,other);
  if (iVar4 < 0) {
    assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/format.h"
                ,0xab7,"");
  }
  sVar1 = (other->bigits_).super_buffer<unsigned_int>.size_;
  if (sVar1 != 0) {
    uVar5 = other->exp_ - this->exp_;
    uVar6 = (ulong)uVar5;
    puVar2 = (other->bigits_).super_buffer<unsigned_int>.ptr_;
    puVar3 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    sVar7 = 0;
    lVar9 = 0;
    do {
      if ((int)uVar5 < 0) goto LAB_0012d8d0;
      lVar10 = (ulong)puVar3[uVar6 + sVar7] + (lVar9 - (ulong)puVar2[sVar7]);
      puVar3[uVar6 + sVar7] = (uint)lVar10;
      lVar9 = lVar10 >> 0x3f;
      sVar7 = sVar7 + 1;
    } while (sVar1 != sVar7);
    if (lVar10 < 0) {
      if ((int)(uVar6 + sVar7) < 0) {
LAB_0012d8d0:
        assert_fail("/workspace/llm4binary/github/license_c_cmakelists/rezalas[P]riftshadow/code/include/spdlog/fmt/bundled/core.h"
                    ,0x199,"negative value");
      }
      puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
      uVar6 = uVar6 + sVar7 & 0xffffffff;
      uVar8 = (ulong)puVar2[uVar6];
      lVar9 = -1;
      do {
        uVar8 = (uVar8 & 0xffffffff) + lVar9;
        lVar9 = (long)uVar8 >> 0x3f;
      } while ((long)uVar8 < 0);
      puVar2[uVar6] = (uint)uVar8;
    }
  }
  remove_leading_zeros(this);
  return;
}

Assistant:

FMT_CONSTEXPR20 void subtract_aligned(const bigint& other) {
    FMT_ASSERT(other.exp_ >= exp_, "unaligned bigints");
    FMT_ASSERT(compare(*this, other) >= 0, "");
    bigit borrow = 0;
    int i = other.exp_ - exp_;
    for (size_t j = 0, n = other.bigits_.size(); j != n; ++i, ++j)
      subtract_bigits(i, other.bigits_[j], borrow);
    while (borrow > 0) subtract_bigits(i, 0, borrow);
    remove_leading_zeros();
  }